

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

void av1_free_cdef_buffers(AV1_COMMON *cm,AV1CdefWorkerData **cdef_worker,AV1CdefSync *cdef_sync)

{
  int num_mi_rows;
  uint uVar1;
  int plane;
  long lVar2;
  ulong uVar3;
  
  num_mi_rows = (cm->cdef_info).allocated_mi_rows;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    aom_free((cm->cdef_info).linebuf[lVar2]);
    (cm->cdef_info).linebuf[lVar2] = (uint16_t *)0x0;
  }
  free_cdef_bufs((cm->cdef_info).colbuf,&(cm->cdef_info).srcbuf);
  free_cdef_row_sync(&cdef_sync->cdef_row_mt,num_mi_rows);
  uVar1 = (cm->cdef_info).allocated_num_workers;
  uVar3 = (ulong)uVar1;
  if ((1 < (int)uVar1) && (*cdef_worker != (AV1CdefWorkerData *)0x0)) {
    lVar2 = uVar3 * 0x1f8 + -0x1e8;
    for (; 1 < (long)uVar3; uVar3 = uVar3 - 1) {
      free_cdef_bufs((uint16_t **)((long)(*cdef_worker)->colbuf + lVar2 + -0x10),
                     (uint16_t **)((long)(*cdef_worker)->colbuf + lVar2 + 8));
      lVar2 = lVar2 + -0x1f8;
    }
    aom_free(*cdef_worker);
    *cdef_worker = (AV1CdefWorkerData *)0x0;
  }
  return;
}

Assistant:

void av1_free_cdef_buffers(AV1_COMMON *const cm,
                           AV1CdefWorkerData **cdef_worker,
                           AV1CdefSync *cdef_sync) {
  CdefInfo *cdef_info = &cm->cdef_info;
  const int num_mi_rows = cdef_info->allocated_mi_rows;

  for (int plane = 0; plane < MAX_MB_PLANE; plane++) {
    aom_free(cdef_info->linebuf[plane]);
    cdef_info->linebuf[plane] = NULL;
  }
  // De-allocation of column buffer & source buffer (worker_0).
  free_cdef_bufs(cdef_info->colbuf, &cdef_info->srcbuf);

  free_cdef_row_sync(&cdef_sync->cdef_row_mt, num_mi_rows);

  if (cdef_info->allocated_num_workers < 2) return;
  if (*cdef_worker != NULL) {
    for (int idx = cdef_info->allocated_num_workers - 1; idx >= 1; idx--) {
      // De-allocation of column buffer & source buffer for remaining workers.
      free_cdef_bufs((*cdef_worker)[idx].colbuf, &(*cdef_worker)[idx].srcbuf);
    }
    aom_free(*cdef_worker);
    *cdef_worker = NULL;
  }
}